

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attach_info.cpp
# Opt level: O1

StorageOptions * __thiscall
duckdb::AttachInfo::GetStorageOptions(StorageOptions *__return_storage_ptr__,AttachInfo *this)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  uint64_t uVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  _Alloc_hider _Var6;
  optional_idx local_90;
  string local_88;
  SerializationCompatibility local_68;
  optional_idx *local_38;
  
  *(undefined4 *)&(__return_storage_ptr__->storage_version).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->storage_version).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->block_header_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->block_header_size).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->block_alloc_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->block_alloc_size).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->row_group_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->row_group_size).index + 4) = 0xffffffff;
  __return_storage_ptr__->encryption = false;
  p_Var4 = (this->options)._M_h._M_before_begin._M_nxt;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    _Var6._M_p = (pointer)0xffffffffffffffff;
    bVar5 = false;
  }
  else {
    local_38 = &__return_storage_ptr__->row_group_size;
    _Var6._M_p = (pointer)0xffffffffffffffff;
    bVar5 = false;
    do {
      p_Var1 = p_Var4 + 1;
      iVar2 = ::std::__cxx11::string::compare((char *)p_Var1);
      if (iVar2 == 0) {
        uVar3 = Value::GetValue<unsigned_long>((Value *)(p_Var4 + 5));
        optional_idx::optional_idx((optional_idx *)&local_68,uVar3);
        _Var6._M_p = local_68.duckdb_version._M_dataplus._M_p;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)p_Var1);
        if (iVar2 == 0) {
          (__return_storage_ptr__->block_header_size).index = 0x28;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v1.3.0","");
          SerializationCompatibility::FromString(&local_68,&local_88);
          optional_idx::optional_idx(&local_90,local_68.serialization_version);
          (__return_storage_ptr__->storage_version).index = local_90.index;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.duckdb_version._M_dataplus._M_p != &local_68.duckdb_version.field_2) {
            operator_delete(local_68.duckdb_version._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          bVar5 = true;
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)p_Var1);
          if (iVar2 == 0) {
            uVar3 = Value::GetValue<unsigned_long>((Value *)(p_Var4 + 5));
            optional_idx::optional_idx(local_38,uVar3);
          }
          else {
            iVar2 = ::std::__cxx11::string::compare((char *)p_Var1);
            if (iVar2 == 0) {
              Value::ToString_abi_cxx11_(&local_88,(Value *)(p_Var4 + 5));
              SerializationCompatibility::FromString(&local_68,&local_88);
              optional_idx::optional_idx(&local_90,local_68.serialization_version);
              (__return_storage_ptr__->storage_version).index = local_90.index;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68.duckdb_version._M_dataplus._M_p != &local_68.duckdb_version.field_2) {
                operator_delete(local_68.duckdb_version._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p);
              }
            }
          }
        }
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  __return_storage_ptr__->encryption = bVar5;
  (__return_storage_ptr__->block_alloc_size).index = (idx_t)_Var6._M_p;
  return __return_storage_ptr__;
}

Assistant:

StorageOptions AttachInfo::GetStorageOptions() const {
	StorageOptions storage_options;
	for (auto &entry : options) {
		if (entry.first == "block_size") {
			// Extract the block allocation size. This is NOT the actual memory available on a block (block_size),
			// even though the corresponding option we expose to the user is called "block_size".
			storage_options.block_alloc_size = entry.second.GetValue<uint64_t>();
		} else if (entry.first == "encryption_key") {
			storage_options.block_header_size = DEFAULT_ENCRYPTION_BLOCK_HEADER_SIZE;
			storage_options.encryption = true;
			// set storage version to v1.3.0
			storage_options.storage_version = SerializationCompatibility::FromString("v1.3.0").serialization_version;
		} else if (entry.first == "row_group_size") {
			storage_options.row_group_size = entry.second.GetValue<uint64_t>();
		} else if (entry.first == "storage_version") {
			storage_options.storage_version =
			    SerializationCompatibility::FromString(entry.second.ToString()).serialization_version;
		}
	}
	return storage_options;
}